

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainReal.c
# Opt level: O0

int Abc_RealMain(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  Abc_Frame_t *pAbc_00;
  char *pcVar5;
  Gia_Man_t *pGVar6;
  int local_8838;
  anon_enum_32 fBatch;
  int fFinalWrite;
  int fInitRead;
  int fInitSource;
  int c;
  int fStatus;
  char *sCommand;
  char *sInFile;
  char *sOutFile;
  char sWriteCmd [1000];
  char local_8418 [8];
  char sReadCmd [1000];
  char local_8028 [8];
  char sCommandTmp [32768];
  Vec_Str_t *sCommandUsr;
  Abc_Frame_t *pAbc;
  char **argv_local;
  int argc_local;
  
  sCommandTmp._32760_8_ = Vec_StrAlloc(1000);
  pAbc_00 = Abc_FrameGetGlobalFrame();
  pAbc_00->sBinary = *argv;
  local_8838 = 0;
  bVar1 = true;
  bVar2 = false;
  bVar3 = false;
  sInFile = (char *)0x0;
  sCommand = (char *)0x0;
  sprintf(local_8418,"read");
  sprintf((char *)&sOutFile,"write");
  Extra_UtilGetoptReset();
LAB_0038bc73:
  iVar4 = Extra_UtilGetopt(argc,argv,"c:q:C:Q:S:hf:F:o:st:T:xb");
  if (iVar4 != -1) {
    switch(iVar4) {
    case 0x43:
      iVar4 = Vec_StrSize((Vec_Str_t *)sCommandTmp._32760_8_);
      if (0 < iVar4) {
        Vec_StrAppend((Vec_Str_t *)sCommandTmp._32760_8_," ; ");
      }
      Vec_StrAppend((Vec_Str_t *)sCommandTmp._32760_8_,globalUtilOptarg);
      local_8838 = 2;
      goto LAB_0038bc73;
    default:
      break;
    case 0x46:
      iVar4 = Vec_StrSize((Vec_Str_t *)sCommandTmp._32760_8_);
      if (0 < iVar4) {
        Vec_StrAppend((Vec_Str_t *)sCommandTmp._32760_8_," ; ");
      }
      Vec_StrPrintF((Vec_Str_t *)sCommandTmp._32760_8_,"source -x %s",globalUtilOptarg);
      local_8838 = 1;
      goto LAB_0038bc73;
    case 0x51:
      iVar4 = Vec_StrSize((Vec_Str_t *)sCommandTmp._32760_8_);
      if (0 < iVar4) {
        Vec_StrAppend((Vec_Str_t *)sCommandTmp._32760_8_," ; ");
      }
      Vec_StrAppend((Vec_Str_t *)sCommandTmp._32760_8_,globalUtilOptarg);
      local_8838 = 4;
      goto LAB_0038bc73;
    case 0x53:
      iVar4 = Vec_StrSize((Vec_Str_t *)sCommandTmp._32760_8_);
      if (0 < iVar4) {
        Vec_StrAppend((Vec_Str_t *)sCommandTmp._32760_8_," ; ");
      }
      Vec_StrAppend((Vec_Str_t *)sCommandTmp._32760_8_,globalUtilOptarg);
      local_8838 = 5;
      goto LAB_0038bc73;
    case 0x54:
      iVar4 = TypeCheck(pAbc_00,globalUtilOptarg);
      if (iVar4 != 0) {
        iVar4 = strcmp(globalUtilOptarg,"none");
        if (iVar4 != 0) {
          bVar3 = true;
          sprintf((char *)&sOutFile,"write_%s",globalUtilOptarg);
        }
        local_8838 = 1;
        goto LAB_0038bc73;
      }
      break;
    case 0x62:
      Abc_FrameSetBridgeMode();
      goto LAB_0038bc73;
    case 99:
      iVar4 = Vec_StrSize((Vec_Str_t *)sCommandTmp._32760_8_);
      if (0 < iVar4) {
        Vec_StrAppend((Vec_Str_t *)sCommandTmp._32760_8_," ; ");
      }
      Vec_StrAppend((Vec_Str_t *)sCommandTmp._32760_8_,globalUtilOptarg);
      local_8838 = 1;
      goto LAB_0038bc73;
    case 0x66:
      iVar4 = Vec_StrSize((Vec_Str_t *)sCommandTmp._32760_8_);
      if (0 < iVar4) {
        Vec_StrAppend((Vec_Str_t *)sCommandTmp._32760_8_," ; ");
      }
      Vec_StrPrintF((Vec_Str_t *)sCommandTmp._32760_8_,"source %s",globalUtilOptarg);
      local_8838 = 1;
      goto LAB_0038bc73;
    case 0x68:
      break;
    case 0x6f:
      sInFile = globalUtilOptarg;
      bVar3 = true;
      goto LAB_0038bc73;
    case 0x71:
      iVar4 = Vec_StrSize((Vec_Str_t *)sCommandTmp._32760_8_);
      if (0 < iVar4) {
        Vec_StrAppend((Vec_Str_t *)sCommandTmp._32760_8_," ; ");
      }
      Vec_StrAppend((Vec_Str_t *)sCommandTmp._32760_8_,globalUtilOptarg);
      local_8838 = 3;
      goto LAB_0038bc73;
    case 0x73:
      bVar1 = false;
      goto LAB_0038bc73;
    case 0x74:
      iVar4 = TypeCheck(pAbc_00,globalUtilOptarg);
      if (iVar4 != 0) {
        iVar4 = strcmp(globalUtilOptarg,"none");
        if (iVar4 != 0) {
          bVar2 = true;
          sprintf(local_8418,"read_%s",globalUtilOptarg);
        }
        local_8838 = 1;
        goto LAB_0038bc73;
      }
      break;
    case 0x78:
      goto switchD_0038bcc5_caseD_78;
    }
    Abc_UtilsPrintHello(pAbc_00);
    Abc_UtilsPrintUsage(pAbc_00,*argv);
    return 1;
  }
  Vec_StrPush((Vec_Str_t *)sCommandTmp._32760_8_,'\0');
  if (local_8838 == 5) {
    pcVar5 = Vec_StrArray((Vec_Str_t *)sCommandTmp._32760_8_);
    Wlc_StdinProcessSmt(pAbc_00,pcVar5);
    Abc_Stop();
  }
  else {
    iVar4 = Abc_FrameIsBridgeMode();
    if (iVar4 == 0) {
      if ((((local_8838 != 0) && (local_8838 != 3)) && (local_8838 != 4)) &&
         (iVar4 = Vec_StrSize((Vec_Str_t *)sCommandTmp._32760_8_), 0 < iVar4)) {
        pcVar5 = Vec_StrArray((Vec_Str_t *)sCommandTmp._32760_8_);
        Abc_Print(1,"ABC command line: \"%s\".\n\n",pcVar5);
      }
    }
    else {
      pGVar6 = Gia_ManFromBridge((FILE *)_stdin,(Vec_Int_t **)0x0);
      pAbc_00->pGia = pGVar6;
    }
    if (local_8838 != 0) {
      pAbc_00->fBatchMode = 1;
      if (argc == globalUtilOptind) {
        sCommand = (char *)0x0;
      }
      else if (argc - globalUtilOptind == 1) {
        bVar2 = true;
        sCommand = argv[globalUtilOptind];
      }
      else {
        Abc_UtilsPrintUsage(pAbc_00,*argv);
      }
      if (bVar1) {
        Abc_UtilsSource(pAbc_00);
      }
      fInitSource = 0;
      if ((bVar2) && (sCommand != (char *)0x0)) {
        sprintf(local_8028,"%s %s",local_8418,sCommand);
        fInitSource = Cmd_CommandExecute(pAbc_00,local_8028);
      }
      if (fInitSource == 0) {
        pcVar5 = Vec_StrArray((Vec_Str_t *)sCommandTmp._32760_8_);
        iVar4 = Cmd_CommandExecute(pAbc_00,pcVar5);
        if (((iVar4 == 0) || (iVar4 == -1)) && ((bVar3 && (sInFile != (char *)0x0)))) {
          sprintf(local_8028,"%s %s",&sOutFile,sInFile);
          Cmd_CommandExecute(pAbc_00,local_8028);
        }
      }
      if ((local_8838 == 2) || (local_8838 == 4)) {
        local_8838 = 0;
        pAbc_00->fBatchMode = 0;
      }
    }
    Vec_StrFreeP((Vec_Str_t **)(sCommandTmp + 0x7ff8));
    if (local_8838 == 0) {
      Abc_UtilsPrintHello(pAbc_00);
      Cmd_HistoryPrint(pAbc_00,10);
      if (bVar1) {
        Abc_UtilsSource(pAbc_00);
      }
      while (iVar4 = feof(_stdin), iVar4 == 0) {
        pcVar5 = Abc_UtilsGetUsersInput(pAbc_00);
        iVar4 = Cmd_CommandExecute(pAbc_00,pcVar5);
        if ((iVar4 == -1) || (iVar4 == -2)) break;
      }
    }
    Abc_Stop();
  }
  return 0;
switchD_0038bcc5_caseD_78:
  bVar3 = false;
  bVar2 = false;
  local_8838 = 1;
  goto LAB_0038bc73;
}

Assistant:

int Abc_RealMain( int argc, char * argv[] )
{
    Abc_Frame_t * pAbc;
    Vec_Str_t* sCommandUsr = Vec_StrAlloc(1000);
    char sCommandTmp[ABC_MAX_STR], sReadCmd[1000], sWriteCmd[1000];
    const char * sOutFile, * sInFile;
    char * sCommand;
    int  fStatus = 0;
    int c, fInitSource, fInitRead, fFinalWrite;

    enum {
        INTERACTIVE, // interactive mode
        BATCH, // batch mode, run a command and quit
        BATCH_THEN_INTERACTIVE, // run a command, then back to interactive mode
        BATCH_QUIET, // as in batch mode, but don't echo the command
        BATCH_QUIET_THEN_INTERACTIVE, // as in batch then interactive mode, but don't echo the command
        BATCH_SMT // special batch mode, which expends SMTLIB problem via stdin
    } fBatch;

    // added to detect memory leaks
    // watch for {,,msvcrtd.dll}*__p__crtBreakAlloc()
    // (http://support.microsoft.com/kb/151585)
#if defined(_DEBUG) && defined(_MSC_VER)
    _CrtSetDbgFlag( _CRTDBG_ALLOC_MEM_DF | _CRTDBG_LEAK_CHECK_DF );
#endif

    // get global frame (singleton pattern)
    // will be initialized on first call
    pAbc = Abc_FrameGetGlobalFrame();
    pAbc->sBinary = argv[0];

    // default options
    fBatch      = INTERACTIVE;
    fInitSource = 1;
    fInitRead   = 0;
    fFinalWrite = 0;
    sInFile = sOutFile = NULL;
    sprintf( sReadCmd,  "read"  );
    sprintf( sWriteCmd, "write" );

    Extra_UtilGetoptReset();
    while ((c = Extra_UtilGetopt(argc, argv, "c:q:C:Q:S:hf:F:o:st:T:xb")) != EOF) {
        switch(c) {
            case 'c':
                if( Vec_StrSize(sCommandUsr) > 0 )
                {
                    Vec_StrAppend(sCommandUsr, " ; ");
                }
                Vec_StrAppend(sCommandUsr, globalUtilOptarg );
                fBatch = BATCH;
                break;

            case 'q':
                if( Vec_StrSize(sCommandUsr) > 0 )
                {
                    Vec_StrAppend(sCommandUsr, " ; ");
                }
                Vec_StrAppend(sCommandUsr, globalUtilOptarg );
                fBatch = BATCH_QUIET;
                break;

            case 'Q':
                if( Vec_StrSize(sCommandUsr) > 0 )
                {
                    Vec_StrAppend(sCommandUsr, " ; ");
                }
                Vec_StrAppend(sCommandUsr, globalUtilOptarg );
                fBatch = BATCH_QUIET_THEN_INTERACTIVE;
                break;

            case 'C':
                if( Vec_StrSize(sCommandUsr) > 0 )
                {
                    Vec_StrAppend(sCommandUsr, " ; ");
                }
                Vec_StrAppend(sCommandUsr, globalUtilOptarg );
                fBatch = BATCH_THEN_INTERACTIVE;
                break;

            case 'S':
                if( Vec_StrSize(sCommandUsr) > 0 )
                {
                    Vec_StrAppend(sCommandUsr, " ; ");
                }
                Vec_StrAppend(sCommandUsr, globalUtilOptarg );
                fBatch = BATCH_SMT;
                break;

            case 'f':
                if( Vec_StrSize(sCommandUsr) > 0 )
                {
                    Vec_StrAppend(sCommandUsr, " ; ");
                }
                Vec_StrPrintF(sCommandUsr, "source %s", globalUtilOptarg );
                fBatch = BATCH;
                break;

            case 'F':
                if( Vec_StrSize(sCommandUsr) > 0 )
                {
                    Vec_StrAppend(sCommandUsr, " ; ");
                }
                Vec_StrPrintF(sCommandUsr, "source -x %s", globalUtilOptarg );
                fBatch = BATCH;
                break;

            case 'h':
                goto usage;
                break;

            case 'o':
                sOutFile = globalUtilOptarg;
                fFinalWrite = 1;
                break;

            case 's':
                fInitSource = 0;
                break;

            case 't':
                if ( TypeCheck( pAbc, globalUtilOptarg ) )
                {
                    if ( !strcmp(globalUtilOptarg, "none") == 0 )
                    {
                        fInitRead = 1;
                        sprintf( sReadCmd, "read_%s", globalUtilOptarg );
                    }
                }
                else {
                    goto usage;
                }
                fBatch = BATCH;
                break;

            case 'T':
                if ( TypeCheck( pAbc, globalUtilOptarg ) )
                {
                    if (!strcmp(globalUtilOptarg, "none") == 0)
                    {
                        fFinalWrite = 1;
                        sprintf( sWriteCmd, "write_%s", globalUtilOptarg);
                    }
                }
                else {
                    goto usage;
                }
                fBatch = BATCH;
                break;

            case 'x':
                fFinalWrite = 0;
                fInitRead   = 0;
                fBatch = BATCH;
                break;

            case 'b':
                Abc_FrameSetBridgeMode();
                break;

            default:
                goto usage;
        }
    }

    Vec_StrPush(sCommandUsr, '\0');

    if ( fBatch == BATCH_SMT )
    {
        Wlc_StdinProcessSmt( pAbc, Vec_StrArray(sCommandUsr) );
        Abc_Stop();
        return 0;
    }

    if ( Abc_FrameIsBridgeMode() )
    {
        extern Gia_Man_t * Gia_ManFromBridge( FILE * pFile, Vec_Int_t ** pvInit );
        pAbc->pGia = Gia_ManFromBridge( stdin, NULL );
    }
    else if ( fBatch!=INTERACTIVE && fBatch!=BATCH_QUIET && fBatch!=BATCH_QUIET_THEN_INTERACTIVE && Vec_StrSize(sCommandUsr)>0 )
        Abc_Print( 1, "ABC command line: \"%s\".\n\n", Vec_StrArray(sCommandUsr) );

    if ( fBatch!=INTERACTIVE )
    {
        pAbc->fBatchMode = 1;

        if (argc - globalUtilOptind == 0)
        {
            sInFile = NULL;
        }
        else if (argc - globalUtilOptind == 1)
        {
            fInitRead = 1;
            sInFile = argv[globalUtilOptind];
        }
        else
        {
            Abc_UtilsPrintUsage( pAbc, argv[0] );
        }

        // source the resource file
        if ( fInitSource )
        {
            Abc_UtilsSource( pAbc );
        }

        fStatus = 0;
        if ( fInitRead && sInFile )
        {
            sprintf( sCommandTmp, "%s %s", sReadCmd, sInFile );
            fStatus = Cmd_CommandExecute( pAbc, sCommandTmp );
        }

        if ( fStatus == 0 )
        {
            /* cmd line contains `source <file>' */
            fStatus = Cmd_CommandExecute( pAbc, Vec_StrArray(sCommandUsr) );
            if ( (fStatus == 0 || fStatus == -1) && fFinalWrite && sOutFile )
            {
                sprintf( sCommandTmp, "%s %s", sWriteCmd, sOutFile );
                fStatus = Cmd_CommandExecute( pAbc, sCommandTmp );
            }
        }

        if (fBatch == BATCH_THEN_INTERACTIVE || fBatch == BATCH_QUIET_THEN_INTERACTIVE){
            fBatch = INTERACTIVE;
            pAbc->fBatchMode = 0;
        }
    }

    Vec_StrFreeP(&sCommandUsr);

    if ( fBatch==INTERACTIVE )
    {
        // start interactive mode

        // print the hello line
        Abc_UtilsPrintHello( pAbc );
        // print history of the recent commands
        Cmd_HistoryPrint( pAbc, 10 );

        // source the resource file
        if ( fInitSource )
        {
            Abc_UtilsSource( pAbc );
        }

        // execute commands given by the user
        while ( !feof(stdin) )
        {
            // print command line prompt and
            // get the command from the user
            sCommand = Abc_UtilsGetUsersInput( pAbc );

            // execute the user's command
            fStatus = Cmd_CommandExecute( pAbc, sCommand );

            // stop if the user quitted or an error occurred
            if ( fStatus == -1 || fStatus == -2 )
                break;
        }
    }

    // if the memory should be freed, quit packages
//    if ( fStatus < 0 ) 
    {
        Abc_Stop();
    }
    return 0;

usage:
    Abc_UtilsPrintHello( pAbc );
    Abc_UtilsPrintUsage( pAbc, argv[0] );
    return 1;
}